

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_add_static_int_array_option(void)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  cargo_t cargo;
  size_t count;
  int a [3];
  char *args [5];
  
  iVar3 = cargo_init(&cargo,0,"program");
  if (iVar3 == 0) {
    args[4] = "3";
    args[2] = "1";
    args[3] = "-2";
    args[0]._0_4_ = 0x127be1;
    args[0]._4_4_ = 0;
    args[1]._0_4_ = 0x127b8a;
    args[1]._4_4_ = 0;
    count = 0;
    iVar3 = cargo_add_option(cargo,0,"--beta -b","Description",".[i]#",a,&count,3);
    if (iVar3 == 0) {
      iVar3 = cargo_parse(cargo,0,1,5,args);
      if (iVar3 == 0) {
        if (count == 3) {
          printf("Read %lu values from int array:\n",3);
          for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
            printf("  %d\n",(ulong)(uint)a[lVar5]);
          }
          puts("Check that \"a\" has ARRAY_SIZE elements");
          if (count == 3) {
            pcVar4 = "Array contains unexpected value";
            lVar5 = 0;
            do {
              if (lVar5 == 0xc) {
                pcVar4 = (char *)0x0;
                break;
              }
              piVar2 = (int *)((long)a + lVar5);
              piVar1 = (int *)((long)&DAT_00120138 + lVar5);
              lVar5 = lVar5 + 4;
            } while (*piVar2 == *piVar1);
          }
          else {
            pcVar4 = "a array count count is not expected ARRAY_SIZE";
          }
        }
        else {
          pcVar4 = "Array count is invalid";
        }
      }
      else {
        pcVar4 = "Failed to parse array: a[ARRAY_SIZE]";
      }
    }
    else {
      pcVar4 = "Failed to add a[ARRAY_SIZE] array option";
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar4 = "Failed to init cargo";
  }
  return pcVar4;
}

Assistant:

_TEST_START(TEST_add_static_int_array_option)
{
    int a[3];
    int a_expect[3] = { 1, -2, 3 };
    char *args[] = { "program", "--beta", "1", "-2", "3" };
    _ADD_TEST_FIXED_ARRAY(".[i]#", "%d");
    _TEST_CLEANUP();
}